

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  StreamMetaCb_t local_78;
  SignalMetaCb_t local_58;
  DataAsDoubleCb_t local_38;
  
  signal(0xf,sigHandler);
  signal(2,sigHandler);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&local_b8,argv[1],(allocator *)&local_98);
    bVar1 = std::operator==(&local_b8,"-h");
    std::__cxx11::string::~string((string *)&local_b8);
    if (!bVar1) {
      if ((main::streamMetaFilename_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&main::streamMetaFilename_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string
                  ((string *)&main::streamMetaFilename_abi_cxx11_,"streamMeta.dump",
                   (allocator *)&local_b8);
        __cxa_atexit(std::__cxx11::string::~string,&main::streamMetaFilename_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&main::streamMetaFilename_abi_cxx11_);
      }
      std::ofstream::open((string *)streamMetaFile,0x17c7a0);
      local_38.super__Function_base._M_functor._8_8_ = 0;
      local_38.super__Function_base._M_functor._M_unused._M_object = dataCb;
      local_38._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long),_void_(*)(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
           ::_M_invoke;
      local_38.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long),_void_(*)(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
           ::_M_manager;
      hbm::streaming::SignalContainer::setDataAsDoubleCb(&signalContainer,&local_38);
      std::_Function_base::~_Function_base(&local_38.super__Function_base);
      local_58.super__Function_base._M_functor._8_8_ = 0;
      local_58.super__Function_base._M_functor._M_unused._M_object = signalMetaInformationCb;
      local_58._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_invoke;
      local_58.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_manager;
      hbm::streaming::SignalContainer::setSignalMetaCb(&signalContainer,&local_58);
      std::_Function_base::~_Function_base(&local_58.super__Function_base);
      local_78.super__Function_base._M_functor._8_8_ = 0;
      local_78.super__Function_base._M_functor._M_unused._M_object = streamMetaInformationCb;
      local_78._M_invoker =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_invoke;
      local_78.super__Function_base._M_manager =
           std::
           _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
           ::_M_manager;
      hbm::streaming::StreamClient::setStreamMetaCb(&streamClient,&local_78);
      std::_Function_base::~_Function_base(&local_78.super__Function_base);
      streamClient.m_pSignalContainer = &signalContainer;
      std::__cxx11::string::string((string *)&local_b8,argv[1],&local_b9);
      std::__cxx11::string::string((string *)&local_98,"",&local_ba);
      hbm::streaming::StreamClient::start
                (&streamClient,&local_b8,(string *)hbm::streaming::DAQSTREAM_PORT_abi_cxx11_,
                 &local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      return 0;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"syntax: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," <stream server address>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	// Some signals should lead to a normal shutdown of the daq stream client. Afterwards the program exists.
	signal( SIGTERM, &sigHandler);
	signal( SIGINT, &sigHandler);

	if ((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "syntax: " << argv[0] << " <stream server address>" << std::endl;
		return EXIT_SUCCESS;
	}

	static const std::string streamMetaFilename = "streamMeta.dump";
	streamMetaFile.open(streamMetaFilename);

	signalContainer.setDataAsDoubleCb(dataCb);
	signalContainer.setSignalMetaCb(signalMetaInformationCb);

	streamClient.setStreamMetaCb(streamMetaInformationCb);
	streamClient.setSignalContainer(&signalContainer);

	// connect to the daq stream service and give control to the receiving function.
	// returns on signal (terminate, interrupt) buffer overrun on the server side or loss of connection.
	streamClient.start(argv[1], hbm::streaming::DAQSTREAM_PORT);
	return EXIT_SUCCESS;
}